

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  string **local_348;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string shader_source;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [32];
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [32];
  string local_238 [32];
  undefined1 local_218 [8];
  string iteration_specific_shader_code_part;
  size_t max_dimension_index;
  undefined1 local_1d0 [8];
  string shader_code_common_part;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_120 [8];
  string y_variable_initializaton;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string x_variable_initializaton;
  allocator<char> local_39;
  string local_38 [8];
  string variable_initialiser;
  TestShaderType tested_shader_type_local;
  ExpressionsIndexingArray2<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  variable_initialiser.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"    float[](float[](float(float(float(float(float(float(1.0))))))));\n",
             &local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"float",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"1.0",
             (allocator<char> *)(y_variable_initializaton.field_2._M_local_buf + 0xf));
  recursively_initialise(&local_b0,this,&local_d0,8,&local_f8);
  std::operator+(&local_90,"    float x[2][2][2][2][2][2][2][1] = ",&local_b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_90,";\n");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(y_variable_initializaton.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"float",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"1.0",
             (allocator<char> *)(shader_code_common_part.field_2._M_local_buf + 0xf));
  recursively_initialise(&local_160,this,&local_180,8,&local_1a8);
  std::operator+(&local_140,"    float y[2][2][2][2][2][2][2][1] = ",&local_160);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 &local_140,";\n");
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(shader_code_common_part.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &max_dimension_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 shader_start_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &max_dimension_index,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
  std::__cxx11::string::~string((string *)&max_dimension_index);
  for (iteration_specific_shader_code_part.field_2._8_8_ = 1;
      (ulong)iteration_specific_shader_code_part.field_2._8_8_ < 9;
      iteration_specific_shader_code_part.field_2._8_8_ =
           iteration_specific_shader_code_part.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)local_218);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_258,"    x",&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_280,"[0]",&local_281);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])
              (local_238,this,local_258,local_280,iteration_specific_shader_code_part.field_2._8_8_)
    ;
    std::__cxx11::string::operator+=((string *)local_218,local_238);
    std::__cxx11::string::~string(local_238);
    std::__cxx11::string::~string(local_280);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string(local_258);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::operator+=((string *)local_218," = ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2c8,"y",&local_2c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_2f0,"[0]",(allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])
              (local_2a8,this,local_2c8,local_2f0,iteration_specific_shader_code_part.field_2._8_8_)
    ;
    std::__cxx11::string::operator+=((string *)local_218,local_2a8);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string(local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string(local_2c8);
    std::allocator<char>::~allocator(&local_2c9);
    std::__cxx11::string::operator+=((string *)local_218,";\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218);
    switch(variable_initialiser.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)&cs,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)&cs,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)&cs,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xcd6);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)&cs,(string *)shader_end_abi_cxx11_);
    vs = (string *)empty_string_abi_cxx11_;
    tcs = (string *)default_vertex_shader_source_abi_cxx11_;
    tes = (string *)default_tc_shader_source_abi_cxx11_;
    gs = (string *)default_te_shader_source_abi_cxx11_;
    fs = (string *)default_geometry_shader_source_abi_cxx11_;
    local_348 = (string **)default_fragment_shader_source_abi_cxx11_;
    switch(variable_initialiser.field_2._12_4_) {
    case 0:
      local_348 = &cs;
      break;
    case 1:
      tcs = (string *)&cs;
      break;
    case 2:
      vs = (string *)&cs;
      tcs = (string *)empty_string_abi_cxx11_;
      tes = (string *)empty_string_abi_cxx11_;
      gs = (string *)empty_string_abi_cxx11_;
      fs = (string *)empty_string_abi_cxx11_;
      local_348 = (string **)empty_string_abi_cxx11_;
      break;
    case 3:
      fs = (string *)&cs;
      break;
    case 4:
      tes = (string *)&cs;
      break;
    case 5:
      gs = (string *)&cs;
      break;
    default:
      pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar1,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xcd9);
      __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[10])(this,tcs,tes,gs,fs,local_348,vs,1,0);
    std::__cxx11::string::~string((string *)&cs);
    std::__cxx11::string::~string((string *)local_218);
  }
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ExpressionsIndexingArray2<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string variable_initialiser = "    float[](float[](float(float(float(float(float(float(1.0))))))));\n";

	std::string x_variable_initializaton =
		"    float x[2][2][2][2][2][2][2][1] = " + recursively_initialise("float", API::MAX_ARRAY_DIMENSIONS, "1.0") +
		";\n";
	std::string y_variable_initializaton =
		"    float y[2][2][2][2][2][2][2][1] = " + recursively_initialise("float", API::MAX_ARRAY_DIMENSIONS, "1.0") +
		";\n";

	std::string shader_code_common_part = shader_start + x_variable_initializaton + y_variable_initializaton;

	for (size_t max_dimension_index = 1; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		std::string iteration_specific_shader_code_part;

		iteration_specific_shader_code_part += this->extend_string("    x", "[0]", max_dimension_index);
		iteration_specific_shader_code_part += " = ";
		iteration_specific_shader_code_part += this->extend_string("y", "[0]", max_dimension_index);
		iteration_specific_shader_code_part += ";\n";

		std::string shader_source = shader_code_common_part + iteration_specific_shader_code_part;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	}
}